

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getHighestScore(int *score)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  string input;
  unique_lock<std::mutex> lck;
  fstream result;
  ostream local_440 [16];
  byte abStack_430 [496];
  fstream previous_result;
  byte abStack_220 [496];
  
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  std::fstream::fstream((istream *)&previous_result);
  std::fstream::fstream(&result);
  iVar2 = 0;
  while (Mycontroller::quit == false) {
    std::unique_lock<std::mutex>::unique_lock(&lck,&mtx);
    std::condition_variable::wait((unique_lock *)con_var);
    std::fstream::open((char *)&previous_result,0x107004);
    if ((abStack_220[*(long *)(_previous_result + -0x18)] & 5) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&previous_result,(string *)&input);
      iVar2 = std::__cxx11::stoi(&input,(size_t *)0x0,10);
      std::operator<<((ostream *)&std::cout,"\nDone reading from file\n");
      Mycontroller::highestScore = iVar2;
      std::fstream::close();
    }
    else {
      std::operator<<((ostream *)&std::cerr,"\n Can\'t read the previous record \n");
      std::ios::clear((int)*(undefined8 *)(_previous_result + -0x18) +
                      (int)(istream *)&previous_result);
    }
    iVar1 = *score;
    poVar3 = std::operator<<((ostream *)&std::cout,"score = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*score);
    std::endl<char,std::char_traits<char>>(poVar3);
    if (iVar2 < iVar1) {
      std::fstream::open((char *)&result,0x107004);
      poVar3 = (ostream *)&std::cerr;
      pcVar4 = "\nfailed to create ..file not available\n";
      if ((abStack_430[*(long *)(_result + -0x18)] & 5) == 0) {
        std::ostream::operator<<(local_440,*score);
        poVar3 = (ostream *)&std::cout;
        pcVar4 = "\nwrote into file\n";
      }
      std::operator<<(poVar3,pcVar4);
      std::fstream::close();
    }
    std::unique_lock<std::mutex>::~unique_lock(&lck);
  }
  std::fstream::~fstream(&result);
  std::fstream::~fstream(&previous_result);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

void getHighestScore(int& score){
  int r{0};
  std::string  input;
  std::fstream previous_result;
 std::fstream result;
 while(!Mycontroller::quit){

  std::unique_lock<std::mutex> lck(mtx);
  con_var.wait(lck );

  previous_result.open("result.txt", std::ios::in);
  if(!previous_result){
    std::cerr << "\n Can't read the previous record \n" ;
    previous_result.clear();
  } else{
    try{  
      std::getline(previous_result,input);
      r = std::stoi(input);
      std::cout<<"\nDone reading from file\n";

      Mycontroller::highestScore = r;
    }catch(std::exception& e){
      std::cout << e.what();
    }

   previous_result.close();
  }

 
bool newScore = r < score;
// std::cout << "\nnew score is " << newScore <<std::endl;
// std::cout << "r = " << r << std::endl;

std::cout << "score = " << score << std::endl;

  if(newScore){
    result.open("result.txt", std::ios::out);
    if(!result){
      std::cerr << "\nfailed to create ..file not available\n" ;
    }
    else{
      result << score;
      std::cout<<"\nwrote into file\n";
    }
    result.close();
  }


  }
}